

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::BoolParseTester::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  Nullable<const_char_*> failure_msg;
  BoolParseTester *_this;
  BoolParseTester *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (BoolParseTester *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::BoolParseTester_const*,edition_unittest::BoolParseTester*>
                          ((BoolParseTester **)local_18,&local_20,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
               ,0xd48d,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18)
    ;
  }
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&(local_20->field_0)._impl_.repeated_bool_lowfield_,
             (RepeatedField<bool> *)(from_msg + 3));
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&(local_20->field_0)._impl_.packed_bool_lowfield_,(RepeatedField<bool> *)(from_msg + 4)
            );
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&(local_20->field_0)._impl_.repeated_bool_midfield_,
             (RepeatedField<bool> *)(from_msg + 5));
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&(local_20->field_0)._impl_.packed_bool_midfield_,(RepeatedField<bool> *)(from_msg + 6)
            );
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&(local_20->field_0)._impl_.repeated_bool_hifield_,
             (RepeatedField<bool> *)(from_msg + 7));
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&(local_20->field_0)._impl_.packed_bool_hifield_,(RepeatedField<bool> *)(from_msg + 8))
  ;
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar2 & 0xf) != 0) {
    if ((uVar2 & 1) != 0) {
      *(undefined1 *)((long)&local_20->field_0 + 0x80) =
           *(undefined1 *)&from_msg[9]._vptr_MessageLite;
    }
    if ((uVar2 & 2) != 0) {
      (local_20->field_0)._impl_.optional_bool_midfield_ =
           *(bool *)((long)&from_msg[9]._vptr_MessageLite + 1);
    }
    if ((uVar2 & 4) != 0) {
      (local_20->field_0)._impl_.other_field_ =
           *(int32_t *)((long)&from_msg[9]._vptr_MessageLite + 4);
    }
    if ((uVar2 & 8) != 0) {
      *(char *)((long)&local_20->field_0 + 0x88) = (char)from_msg[9]._internal_metadata_.ptr_;
    }
  }
  pHVar1 = &(local_20->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(local_20->field_0)._impl_._extensions_,
             (MessageLite *)_BoolParseTester_default_instance_,(ExtensionSet *)(from_msg + 1));
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_20->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void BoolParseTester::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<BoolParseTester*>(&to_msg);
  auto& from = static_cast<const BoolParseTester&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.BoolParseTester)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_bool_lowfield()->MergeFrom(from._internal_repeated_bool_lowfield());
  _this->_internal_mutable_packed_bool_lowfield()->MergeFrom(from._internal_packed_bool_lowfield());
  _this->_internal_mutable_repeated_bool_midfield()->MergeFrom(from._internal_repeated_bool_midfield());
  _this->_internal_mutable_packed_bool_midfield()->MergeFrom(from._internal_packed_bool_midfield());
  _this->_internal_mutable_repeated_bool_hifield()->MergeFrom(from._internal_repeated_bool_hifield());
  _this->_internal_mutable_packed_bool_hifield()->MergeFrom(from._internal_packed_bool_hifield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.optional_bool_lowfield_ = from._impl_.optional_bool_lowfield_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.optional_bool_midfield_ = from._impl_.optional_bool_midfield_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.other_field_ = from._impl_.other_field_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.optional_bool_hifield_ = from._impl_.optional_bool_hifield_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}